

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  size_t sVar1;
  string local_40;
  
  if (str != (char *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,str,str + sVar1);
    PrintStringTo(&local_40,os);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(string(str), os);
    }
  }